

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

With * sqlite3WithAdd(Parse *pParse,With *pWith,Cte *pCte)

{
  CteUse **ppCVar1;
  Select **ppSVar2;
  byte bVar3;
  byte bVar4;
  sqlite3 *db;
  char *pcVar5;
  ExprList *pEVar6;
  Select *pSVar7;
  char *pcVar8;
  undefined8 uVar9;
  int iVar10;
  With *pWVar11;
  long lVar12;
  long lVar13;
  
  if (pCte == (Cte *)0x0) {
    return pWith;
  }
  db = pParse->db;
  pcVar5 = pCte->zName;
  if (pWith == (With *)0x0 || pcVar5 == (char *)0x0) {
    if (pWith == (With *)0x0) {
      pWVar11 = (With *)sqlite3DbMallocZero(db,0x40);
      goto LAB_00176e02;
    }
    iVar10 = pWith->nCte;
  }
  else {
    iVar10 = pWith->nCte;
    if (0 < iVar10) {
      lVar13 = 0;
LAB_00176d72:
      lVar12 = 0;
      do {
        bVar3 = pcVar5[lVar12];
        bVar4 = pWith->a[lVar13].zName[lVar12];
        if (bVar3 == bVar4) {
          if ((ulong)bVar3 == 0) goto LAB_00176da5;
        }
        else if (""[bVar3] != ""[bVar4]) goto LAB_00176dbc;
        lVar12 = lVar12 + 1;
      } while( true );
    }
  }
LAB_00176ddf:
  pWVar11 = (With *)sqlite3DbRealloc(db,pWith,(long)iVar10 * 0x30 + 0x40);
LAB_00176e02:
  if (db->mallocFailed == '\0') {
    iVar10 = pWVar11->nCte;
    pWVar11->nCte = iVar10 + 1;
    pcVar5 = pCte->zName;
    pEVar6 = pCte->pCols;
    pSVar7 = pCte->pSelect;
    pcVar8 = pCte->zCteErr;
    uVar9 = *(undefined8 *)&pCte->eM10d;
    ppCVar1 = &pWVar11->a[iVar10].pUse;
    *ppCVar1 = pCte->pUse;
    ppCVar1[1] = (CteUse *)uVar9;
    ppSVar2 = &pWVar11->a[iVar10].pSelect;
    *ppSVar2 = pSVar7;
    ppSVar2[1] = (Select *)pcVar8;
    pWVar11->a[iVar10].zName = pcVar5;
    pWVar11->a[iVar10].pCols = pEVar6;
  }
  else {
    cteClear(db,pCte);
    pWVar11 = pWith;
  }
  sqlite3DbFreeNN(db,pCte);
  return pWVar11;
LAB_00176da5:
  sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",pcVar5);
  iVar10 = pWith->nCte;
LAB_00176dbc:
  lVar13 = lVar13 + 1;
  if (iVar10 <= lVar13) goto LAB_00176ddf;
  goto LAB_00176d72;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Cte *pCte               /* CTE to add to the WITH clause */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  if( pCte==0 ){
    return pWith;
  }

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = pCte->zName;
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    sqlite3_int64 nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3CteDelete(db, pCte);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte++] = *pCte;
    sqlite3DbFree(db, pCte);
  }

  return pNew;
}